

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O2

int32_t xx_mask_and_hadd(__m128i vsum1,__m128i vsum2,int i)

{
  ulong uVar1;
  uint in_XMM0_Da;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  uint in_XMM1_Da;
  uint in_XMM1_Db;
  uint in_XMM1_Dc;
  uint in_XMM1_Dd;
  
  uVar1 = vsum1[0] & 0xffffffff;
  return (in_XMM1_Dd & sse_bytemask_2x4[uVar1][1][3]) + (in_XMM0_Dd & sse_bytemask_2x4[uVar1][0][3])
         + (in_XMM1_Db & sse_bytemask_2x4[uVar1][1][1]) +
           (in_XMM0_Db & sse_bytemask_2x4[uVar1][0][1]) +
         (in_XMM1_Dc & sse_bytemask_2x4[uVar1][1][2]) + (in_XMM0_Dc & sse_bytemask_2x4[uVar1][0][2])
         + (in_XMM1_Da & sse_bytemask_2x4[uVar1][1][0]) +
           (in_XMM0_Da & sse_bytemask_2x4[uVar1][0][0]);
}

Assistant:

static int32_t xx_mask_and_hadd(__m128i vsum1, __m128i vsum2, int i) {
  __m128i veca, vecb;
  // Mask and obtain the required 5 values inside the vector
  veca = _mm_and_si128(vsum1, *(__m128i *)sse_bytemask_2x4[i][0]);
  vecb = _mm_and_si128(vsum2, *(__m128i *)sse_bytemask_2x4[i][1]);
  // A = [A0+B0, A1+B1, A2+B2, A3+B3]
  veca = _mm_add_epi32(veca, vecb);
  // B = [A2+B2, A3+B3, 0, 0]
  vecb = _mm_srli_si128(veca, 8);
  // A = [A0+B0+A2+B2, A1+B1+A3+B3, X, X]
  veca = _mm_add_epi32(veca, vecb);
  // B = [A1+B1+A3+B3, 0, 0, 0]
  vecb = _mm_srli_si128(veca, 4);
  // A = [A0+B0+A2+B2+A1+B1+A3+B3, X, X, X]
  veca = _mm_add_epi32(veca, vecb);
  return _mm_cvtsi128_si32(veca);
}